

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::TryConsumeInteger64
          (Parser *this,uint64_t max_value,uint64_t *output)

{
  bool bVar1;
  Token *pTVar2;
  uint64_t *output_local;
  uint64_t max_value_local;
  Parser *this_local;
  
  bVar1 = LookingAtType(this,TYPE_INTEGER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,max_value,output);
    if (bVar1) {
      io::Tokenizer::Next(this->input_);
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::TryConsumeInteger64(uint64_t max_value, uint64_t* output) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
      io::Tokenizer::ParseInteger(input_->current().text, max_value, output)) {
    input_->Next();
    return true;
  }
  return false;
}